

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

int utf8_ptr::s_compare_to(char *p1,size_t bytelen1,char *p2,size_t bytelen2)

{
  uint ch;
  wchar_t wVar1;
  wchar_t wVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = bytelen1 != 0;
  bVar7 = bytelen2 != 0;
  if (bVar6 && bVar7) {
    do {
      wVar1 = s_getch(p1);
      wVar2 = s_getch(p2);
      if (wVar2 < wVar1) {
        return 1;
      }
      if (wVar1 < wVar2) {
        return -1;
      }
      uVar4 = (ulong)((((byte)*p1 >> 5 & 1) != 0) + 1 & (uint)((byte)*p1 >> 7) * 3);
      uVar5 = (ulong)((((byte)*p2 >> 5 & 1) != 0) + 1 & (uint)((byte)*p2 >> 7) * 3);
      bytelen2 = bytelen2 - (uVar5 + 1);
      bVar7 = bytelen2 != 0;
      bytelen1 = bytelen1 - (uVar4 + 1);
      bVar6 = bytelen1 != 0;
      if (bytelen1 == 0) break;
      p1 = (char *)((byte *)p1 + uVar4 + 1);
      p2 = (char *)((byte *)p2 + uVar5 + 1);
    } while (bytelen2 != 0);
  }
  uVar3 = 0xffffffff;
  if (!bVar7) {
    uVar3 = (uint)bVar6;
  }
  return uVar3;
}

Assistant:

int utf8_ptr::s_compare_to(const char *p1, size_t bytelen1,
                           const char *p2, size_t bytelen2)
{
    /* keep going until one or the other string runs out of bytes */
    while (bytelen1 != 0 && bytelen2 != 0)
    {
        wchar_t c1, c2;
        size_t siz1, siz2;
        
        /* get the current character from each string */
        c1 = s_getch(p1);
        c2 = s_getch(p2);

        /* compare them */
        if (c1 > c2)
            return 1;
        else if (c1 < c2)
            return -1;

        /* get the size of each character */
        siz1 = s_charsize(*p1);
        siz2 = s_charsize(*p2);

        /* decrement each counter by the byte size of this character */
        bytelen1 -= siz1;
        bytelen2 -= siz2;

        /* advance to the next character in each string */
        p1 += siz1;
        p2 += siz2;
    }

    /* 
     *   we didn't find any character differences, but one string is
     *   longer than the other -- if they ran out at the same time,
     *   they're identical; otherwise, the one that ran out first is the
     *   lesser one 
     */
    if (bytelen2 != 0)
    {
        /* the first one ran out first, so the first one sorts earlier */
        return -1;
    }
    else if (bytelen1 != 0)
    {
        /* the second one ran out first, so the first one sort later */
        return 1;
    }
    else
    {
        /* they both ran out at the same time */
        return 0;
    }
}